

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::FieldBase::FieldBase(FieldBase *this,FieldBase *rhs)

{
  int iVar1;
  undefined4 uVar2;
  
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_001687a0;
  this->m_tag = rhs->m_tag;
  std::__cxx11::string::string((string *)&this->m_string,(string *)&rhs->m_string);
  (this->m_data)._M_dataplus._M_p = (pointer)&(this->m_data).field_2;
  (this->m_data)._M_string_length = 0;
  (this->m_data).field_2._M_local_buf[0] = '\0';
  iVar1 = (rhs->m_metrics).m_checksum;
  uVar2 = *(undefined4 *)&(rhs->m_metrics).field_0xc;
  (this->m_metrics).m_length = (rhs->m_metrics).m_length;
  (this->m_metrics).m_checksum = iVar1;
  *(undefined4 *)&(this->m_metrics).field_0xc = uVar2;
  return;
}

Assistant:

FieldBase( const FieldBase& rhs )
  : m_tag( rhs.getTag() )
  , m_string( rhs.m_string )
  , m_metrics( rhs.m_metrics )
  {

  }